

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPrivateKey.cpp
# Opt level: O0

bool __thiscall EDPrivateKey::deserialise(EDPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  long *in_RDI;
  ByteString dK;
  ByteString dEC;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar1 = ByteString::size((ByteString *)0x1a7c74);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x1a7c90);
    if (sVar1 != 0) {
      (**(code **)(*in_RDI + 0x50))(in_RDI,local_40);
      (**(code **)(*in_RDI + 0x48))(in_RDI,local_68);
      local_1 = 1;
      goto LAB_001a7d18;
    }
  }
  local_1 = 0;
LAB_001a7d18:
  ByteString::~ByteString((ByteString *)0x1a7d22);
  ByteString::~ByteString((ByteString *)0x1a7d2c);
  return (bool)(local_1 & 1);
}

Assistant:

bool EDPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dK = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dK.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setK(dK);

	return true;
}